

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O0

ggml_backend_buffer_t ggml_backend_alloc_buffer(ggml_backend_t backend,size_t size)

{
  ggml_backend_buffer_t pgVar1;
  size_t in_stack_00000080;
  ggml_backend_buffer_type_t in_stack_00000088;
  
  ggml_backend_get_default_buffer_type((ggml_backend_t)0x15e148);
  pgVar1 = ggml_backend_buft_alloc_buffer(in_stack_00000088,in_stack_00000080);
  return pgVar1;
}

Assistant:

ggml_backend_buffer_t ggml_backend_alloc_buffer(ggml_backend_t backend, size_t size) {
    return ggml_backend_buft_alloc_buffer(ggml_backend_get_default_buffer_type(backend), size);
}